

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ion_file.c
# Opt level: O2

ion_err_t ion_fread_at(ion_file_handle_t file,ion_file_offset_t offset,uint num_bytes,
                      ion_byte_t *write_to)

{
  ion_err_t iVar1;
  
  iVar1 = ion_fseek(file,offset,0);
  if (iVar1 != '\0') {
    return iVar1;
  }
  iVar1 = ion_fread(file,num_bytes,write_to);
  return iVar1;
}

Assistant:

ion_err_t
ion_fread_at(
	ion_file_handle_t	file,
	ion_file_offset_t	offset,
	unsigned int		num_bytes,
	ion_byte_t			*write_to
) {
	ion_err_t error;

	error = ion_fseek(file, offset, ION_FILE_START);

	if (err_ok != error) {
		return error;
	}

	error = ion_fread(file, num_bytes, write_to);
	return error;
}